

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O0

void __thiscall iqxmlrpc::Pool_executor_factory::~Pool_executor_factory(Pool_executor_factory *this)

{
  iterator first;
  iterator local_70;
  iterator local_50;
  undefined1 local_30 [8];
  scoped_lock lk;
  Pool_executor_factory *this_local;
  
  (this->super_Executor_factory_base)._vptr_Executor_factory_base =
       (_func_int **)&PTR__Pool_executor_factory_00251fc0;
  destruction_started(this);
  boost::thread_group::join_all(&this->threads);
  first = std::
          vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
          ::begin(&this->pool);
  lk._8_8_ = std::
             vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
             ::end(&this->pool);
  util::
  delete_ptrs<__gnu_cxx::__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread**,std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread*,std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread*>>>>
            ((__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread_**,_std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>_>
              )first._M_current,
             (__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread_**,_std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>_>
              )lk._8_8_);
  boost::unique_lock<boost::mutex>::unique_lock
            ((unique_lock<boost::mutex> *)local_30,&this->req_queue_lock);
  std::deque<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::begin
            (&local_50,&this->req_queue);
  std::deque<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::end
            (&local_70,&this->req_queue);
  util::
  delete_ptrs<std::_Deque_iterator<iqxmlrpc::Pool_executor*,iqxmlrpc::Pool_executor*&,iqxmlrpc::Pool_executor**>>
            (&local_50,&local_70);
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)local_30);
  boost::mutex::~mutex(&this->destructor_lock);
  boost::condition_variable_any::~condition_variable_any(&this->req_queue_cond);
  boost::mutex::~mutex(&this->req_queue_lock);
  std::deque<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::~deque
            (&this->req_queue);
  std::
  vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ::~vector(&this->pool);
  boost::thread_group::~thread_group(&this->threads);
  Executor_factory_base::~Executor_factory_base(&this->super_Executor_factory_base);
  return;
}

Assistant:

Pool_executor_factory::~Pool_executor_factory()
{
  destruction_started();
  threads.join_all();

  util::delete_ptrs(pool.begin(), pool.end());
  scoped_lock lk(req_queue_lock);
  util::delete_ptrs(req_queue.begin(), req_queue.end());
}